

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# E.h
# Opt level: O2

void __thiscall E::~E(E *this)

{
  this->_vptr_E = (_func_int **)&PTR__E_0010e0a8;
  std::__cxx11::string::~string((string *)&this->_m_error);
  return;
}

Assistant:

virtual ~E(){}